

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

char * __thiscall
Memory::LargeHeapBlock::Alloc(LargeHeapBlock *this,size_t size,ObjectInfoBits attributes)

{
  uint uVar1;
  LargeObjectHeader *header_00;
  Recycler *this_00;
  HeapInfo *pHVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  DummyVTableObject *this_01;
  DummyVTableObject *pDVar6;
  ConfigFlagsTable *pCVar7;
  LargeObjectHeader **ppLVar8;
  undefined8 *in_FS_OFFSET;
  HeapInfo *heapInfo;
  Recycler *recycler;
  char *newAllocAddressEnd;
  char *allocObject;
  LargeObjectHeader *header;
  ObjectInfoBits attributes_local;
  size_t size_local;
  LargeHeapBlock *this_local;
  
  BVar5 = HeapInfo::IsAlignedSize(size);
  if ((BVar5 == 0) && (bVar4 = InPageHeapMode(this), !bVar4)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x259,"(HeapInfo::IsAlignedSize(size) || InPageHeapMode())",
                       "HeapInfo::IsAlignedSize(size) || InPageHeapMode()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if ((attributes & InternalObjectInfoBitMask) != attributes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x25a,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if ((attributes & TrackBit) != NoBit) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x25e,"((attributes & TrackBit) == 0)",
                       "Large tracked object collection not implemented");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  header_00 = (LargeObjectHeader *)this->allocAddressEnd;
  bVar4 = IsPartialSweptHeader(this,header_00);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x263,"(!IsPartialSweptHeader(header))","!IsPartialSweptHeader(header)");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  this_01 = (DummyVTableObject *)(this->allocAddressEnd + 0x20);
  pDVar6 = (DummyVTableObject *)
           ((long)&(this_01->super_FinalizableObject).super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject + size);
  if (((DummyVTableObject *)this->addressEnd < pDVar6) || (pDVar6 < this_01)) {
    return (char *)0x0;
  }
  this_00 = this->heapInfo->recycler;
  pCVar7 = Recycler::GetRecyclerFlagsTable(this_00);
  if ((pCVar7->Verbose & 1U) != 0) {
    pCVar7 = Recycler::GetRecyclerFlagsTable(this_00);
    bVar4 = Js::Phases::IsEnabled(&pCVar7->Trace,MemoryAllocationPhase);
    if (!bVar4) {
      pCVar7 = Recycler::GetRecyclerFlagsTable(this_00);
      bVar4 = Js::Phases::IsEnabled(&pCVar7->Trace,LargeMemoryAllocationPhase);
      if (!bVar4) goto LAB_002fa4f6;
    }
    Output::Print(L"Allocated object of size 0x%x in existing heap block at address 0x%p\n",size,
                  this_01);
  }
LAB_002fa4f6:
  if (this->objectCount <= this->allocCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                       ,0x271,"(allocCount < objectCount)","allocCount < objectCount");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  this->allocAddressEnd = (char *)pDVar6;
  Recycler::VerifyZeroFill(this_00,header_00,0x20);
  BVar5 = Recycler::VerifyEnabled(this_00);
  if (BVar5 != 0) {
    memset(header_00,0,0x20);
  }
  header_00->objectIndex = this->allocCount;
  header_00->objectSize = size;
  header_00->field_0x1a =
       header_00->field_0x1a & 0xfd | ((attributes & WithBarrierBit) == WithBarrierBit) << 1;
  if ((attributes & (FinalizeBit|TrackBit)) != NoBit) {
    memset(this_01,0,8);
    DummyVTableObject::DummyVTableObject(this_01);
  }
  LargeObjectHeader::SetAttributes(header_00,this_00->Cookie,(uchar)attributes);
  ppLVar8 = HeaderList(this);
  uVar1 = this->allocCount;
  this->allocCount = uVar1 + 1;
  ppLVar8[uVar1] = header_00;
  this->finalizeCount = (uint)((attributes & FinalizeBit) != NoBit) + this->finalizeCount;
  if ((attributes & FinalizeBit) != NoBit) {
    pHVar2 = this->heapInfo;
    pHVar2->liveFinalizableObjectCount = pHVar2->liveFinalizableObjectCount + 1;
    pHVar2->newFinalizableObjectCount = pHVar2->newFinalizableObjectCount + 1;
  }
  return (char *)this_01;
}

Assistant:

char*
LargeHeapBlock::Alloc(DECLSPEC_GUARD_OVERFLOW size_t size, ObjectInfoBits attributes)
{
    Assert(HeapInfo::IsAlignedSize(size) || InPageHeapMode());
    Assert((attributes & InternalObjectInfoBitMask) == attributes);
#ifdef RECYCLER_VISITED_HOST
    AssertMsg((attributes & TrackBit) == 0 || (attributes & RecyclerVisitedHostBit), "Large tracked object implemented just for recycler visited objects");
#else
    AssertMsg((attributes & TrackBit) == 0, "Large tracked object collection not implemented");
#endif

    LargeObjectHeader * header = (LargeObjectHeader *)allocAddressEnd;
#if ENABLE_PARTIAL_GC && ENABLE_CONCURRENT_GC
    Assert(!IsPartialSweptHeader(header));
#endif
    char * allocObject = allocAddressEnd + sizeof(LargeObjectHeader);       // shouldn't overflow
    char * newAllocAddressEnd = allocObject + size;
    if (newAllocAddressEnd > addressEnd || newAllocAddressEnd < allocObject)
    {
        return nullptr;
    }

    Recycler* recycler = this->heapInfo->recycler;
#if DBG
    LargeAllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("Allocated object of size 0x%x in existing heap block at address 0x%p\n"), size, allocObject);
#endif

    Assert(allocCount < objectCount);
    allocAddressEnd = newAllocAddressEnd;
#ifdef RECYCLER_ZERO_MEM_CHECK
    recycler->VerifyZeroFill(header, sizeof(LargeObjectHeader));
#endif
#ifdef RECYCLER_MEMORY_VERIFY
    if (recycler->VerifyEnabled())
    {
        memset(header, 0, sizeof(LargeObjectHeader));
    }
#endif

    header->objectIndex = allocCount;
    header->objectSize = size;
#ifdef RECYCLER_WRITE_BARRIER
    header->hasWriteBarrier = (attributes&WithBarrierBit) == WithBarrierBit;
#endif
    if ((attributes & (FinalizeBit | TrackBit)) != 0)
    {
        // Make sure a valid vtable is installed as once the attributes have been set this allocation may be traced by background marking
        allocObject = (char *)new (allocObject) DummyVTableObject();
#if defined(_M_ARM32_OR_ARM64)
        // On ARM, make sure the v-table write is performed before setting the attributes
        MemoryBarrier();
#endif
    }
    header->SetAttributes(recycler->Cookie, (attributes & StoredObjectInfoBitMask));
    HeaderList()[allocCount++] = header;
    finalizeCount += ((attributes & FinalizeBit) != 0);

#ifdef RECYCLER_FINALIZE_CHECK
    if (attributes & FinalizeBit)
    {
        HeapInfo * heapInfo = this->heapInfo;
        heapInfo->liveFinalizableObjectCount++;
        heapInfo->newFinalizableObjectCount++;
    }
#endif

    return allocObject;
}